

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall logger::OutputWorker::Log(OutputWorker *this,QueuedMessage *message)

{
  ostream *poVar1;
  string fmtstr;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar1 = std::operator<<((ostream *)&ss,'{');
  poVar1 = std::operator<<(poVar1,*(char *)((long)&kLevelChars + (long)(int)message->LogLevel));
  poVar1 = std::operator<<(poVar1,'-');
  poVar1 = std::operator<<(poVar1,message->ChannelName);
  poVar1 = std::operator<<(poVar1,"} ");
  std::operator<<(poVar1,(string *)&message->Message);
  std::endl<char,std::char_traits<char>>((ostream *)&ss);
  std::__cxx11::stringbuf::str();
  fwrite(fmtstr._M_dataplus._M_p,1,fmtstr._M_string_length,_stdout);
  std::__cxx11::string::~string((string *)&fmtstr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return;
}

Assistant:

void OutputWorker::Log(QueuedMessage& message)
{
    std::ostringstream ss;
    ss << '{' << LevelToChar(message.LogLevel) << '-' << message.ChannelName << "} " << message.Message;

#if defined(ANDROID)
    std::string fmtstr = ss.str();
    __android_log_print(ANDROID_LOG_ERROR, LOG_TAG, "%s", fmtstr.c_str());
#else // ANDROID
    ss << std::endl;
    std::string fmtstr = ss.str();
    fwrite(fmtstr.c_str(), 1, fmtstr.size(), stdout);
#endif // ANDROID
}